

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O3

char16_t * PAL_wcsrchr(char16_t *string,char16_t c)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  char16_t cVar3;
  
  if (PAL_InitializeChakraCoreCalled) {
    pcVar2 = (char16_t *)0x0;
    cVar3 = *string;
    while (cVar3 != L'\0') {
      if (cVar3 == c) {
        pcVar2 = string;
      }
      pcVar1 = string + 1;
      string = string + 1;
      cVar3 = *pcVar1;
    }
    return pcVar2;
  }
  abort();
}

Assistant:

char16_t _WConst_return *
__cdecl
PAL_wcsrchr(
        const char16_t * string,
        char16_t c)
{
    char16_t *last = NULL;

    PERF_ENTRY(wcsrchr);
    ENTRY("wcsrchr (string=%p (%S), c=%C)\n", string?string:W16_NULLSTRING, string?string:W16_NULLSTRING, c);

    while (*string)
    {
        if (*string == c)
        {
            last = (char16_t *) string;
        }
        string++;
    }

    LOGEXIT("wcsrchr returning char16_t %p (%S)\n", last?last:W16_NULLSTRING, last?last:W16_NULLSTRING);
    PERF_EXIT(wcsrchr);
    return (char16_t *)last;
}